

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O3

void henson::Serialization<henson::Array>::load(BinaryBuffer *bb,Array *x)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  pointer pcVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  void **result;
  size_t index;
  undefined1 local_41;
  ulong local_40;
  vector<char,_std::allocator<char>_> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  unsigned_long local_20;
  
  (*bb->_vptr_BinaryBuffer[1])(bb,&local_40,8);
  (*bb->_vptr_BinaryBuffer[1])(bb,&x->type,8);
  (*bb->_vptr_BinaryBuffer[1])(bb,&x->count,8);
  local_20 = x->type * x->count;
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<char,std::allocator<char>>,std::allocator<std::vector<char,std::allocator<char>>>,unsigned_long>
            (a_Stack_30,&local_38,(allocator<std::vector<char,_std::allocator<char>_>_> *)&local_41,
             &local_20);
  _Var4._M_pi = a_Stack_30[0]._M_pi;
  pvVar3 = local_38;
  local_38 = (vector<char,_std::allocator<char>_> *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (x->storage).
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (x->storage).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pvVar3;
  (x->storage).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    }
  }
  peVar1 = (x->storage).
           super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar2 = (peVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  (*bb->_vptr_BinaryBuffer[1])
            (bb,pcVar2,
             (long)(peVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pcVar2);
  if (local_40 < 5) {
    pcVar2 = (((x->storage).
               super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    switch(local_40) {
    case 0:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 0
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 0;
      }
      break;
    case 1:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 1
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 1;
      }
      break;
    case 2:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 2
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 2;
      }
      break;
    case 3:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 3
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 3;
      }
      break;
    case 4:
      if ((x->address).impl_.
          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .
          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
          super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
          .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ != 4
         ) {
        (x->address).impl_.
        super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .
        super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
        super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
        .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.index_ = 4;
      }
    }
    *(pointer *)
     &(x->address).impl_.
      super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .
      super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
      super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .
      super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
         = pcVar2;
  }
  x->stride = x->type;
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Array& x)
  {
    size_t index;
    henson::load(bb, index);
    henson::load(bb, x.type);
    henson::load(bb, x.count);
    x.storage = std::make_shared<std::vector<char>>(x.count*x.type);
    henson::load(bb, x.storage->data(), x.storage->size());

    void* data = x.storage->data();
    if (index == 0)
        x.address = static_cast<variant_alternative_t<0, Array::Address>>(data);
    else if (index == 1)
        x.address = static_cast<variant_alternative_t<1, Array::Address>>(data);
    else if (index == 2)
        x.address = static_cast<variant_alternative_t<2, Array::Address>>(data);
    else if (index == 3)
        x.address = static_cast<variant_alternative_t<3, Array::Address>>(data);
    else if (index == 4)
        x.address = static_cast<variant_alternative_t<4, Array::Address>>(data);

    x.stride = x.type;
  }